

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicGLSLEarlyFragTests::Run(BasicGLSLEarlyFragTests *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  bool bVar1;
  ulong uVar2;
  int iVar3;
  GLuint GVar4;
  GLint GVar5;
  undefined4 extraout_var;
  ulong uVar6;
  long lVar7;
  long lVar8;
  allocator_type local_8d;
  int local_8c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  
  iVar3 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x18);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x400,&local_8d);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  textures = this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,2,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8814,0x20,0x20,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  glu::CallLogWrapper::glTexImage2D
            (this_00,0xde1,0,0x8814,0x20,0x20,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  local_8c = iVar3;
  GVar4 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(early_fragment_tests) in;\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent uniform image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, vec4(1.0));\n  o_color = vec4(1.0, 0.0, 0.0, 1.0);\n}"
                     ,(bool *)0x0);
  this->m_program[0] = GVar4;
  GVar4 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent uniform image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, vec4(1.0));\n  o_color = vec4(1.0, 0.0, 0.0, 1.0);\n}"
                     ,(bool *)0x0);
  this->m_program[1] = GVar4;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glViewport(this_00,0,0,0x20,0x20);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glEnable(this_00,0xb71);
  glu::CallLogWrapper::glClearColor(this_00,0.0,1.0,0.0,1.0);
  glu::CallLogWrapper::glClearDepthf(this_00,0.0);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[0],"g_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,0);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[1],"g_image");
  glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  lVar8 = -1;
  for (lVar7 = 0; lVar7 != 0x4000; lVar7 = lVar7 + 0x10) {
    tcu::Vector<float,_4>::Vector
              (&local_40,
               (Vector<float,_4> *)
               ((long)(data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7));
    tcu::Vector<float,_4>::Vector(&local_50,1.0);
    if ((((local_40.m_data[0] == local_50.m_data[0]) &&
         (!NAN(local_40.m_data[0]) && !NAN(local_50.m_data[0]))) &&
        (local_40.m_data[1] == local_50.m_data[1])) &&
       (((!NAN(local_40.m_data[1]) && !NAN(local_50.m_data[1]) &&
         (local_40.m_data[2] == local_50.m_data[2])) &&
        ((!NAN(local_40.m_data[2]) && !NAN(local_50.m_data[2]) && (local_8c != 0)))))) {
      if ((local_40.m_data[3] == local_50.m_data[3]) &&
         (!NAN(local_40.m_data[3]) && !NAN(local_50.m_data[3]))) goto LAB_00a58ffe;
    }
  }
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0xde1,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  iVar3 = local_8c;
  lVar8 = 0;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    if (uVar6 == 0x400) break;
    tcu::Vector<float,_4>::Vector
              (&local_60,
               (Vector<float,_4> *)
               ((long)(data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar8));
    tcu::Vector<float,_4>::Vector(&local_70,1.0);
    if (((((local_60.m_data[0] != local_70.m_data[0]) ||
          (NAN(local_60.m_data[0]) || NAN(local_70.m_data[0]))) ||
         (local_60.m_data[1] != local_70.m_data[1])) ||
        ((NAN(local_60.m_data[1]) || NAN(local_70.m_data[1]) ||
         (local_60.m_data[2] != local_70.m_data[2])))) ||
       (NAN(local_60.m_data[2]) || NAN(local_70.m_data[2]))) {
      bVar1 = false;
    }
    else {
      bVar1 = local_70.m_data[3] == local_60.m_data[3];
    }
    lVar8 = lVar8 + 0x10;
    uVar2 = uVar6 + 1;
  } while ((iVar3 == 0) || (bVar1));
  lVar8 = -(ulong)(uVar6 < 0x400);
LAB_00a58ffe:
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return lVar8;
}

Assistant:

virtual long Run()
	{
		int ds = m_context.getRenderContext().getRenderTarget().getDepthBits();

		const int		  kSize = 32;
		std::vector<vec4> data(kSize * kSize);

		glGenTextures(2, m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kSize, kSize, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kSize, kSize, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							  "  gl_Position = i_position;" NL "}";
		const char* glsl_early_frag_tests_fs =
			"#version 420 core" NL "layout(early_fragment_tests) in;" NL "layout(location = 0) out vec4 o_color;" NL
			"layout(rgba32f) coherent uniform image2D g_image;" NL "void main() {" NL
			"  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  imageStore(g_image, coord, vec4(1.0));" NL
			"  o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL "}";
		const char* glsl_fs = "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
							  "layout(rgba32f) coherent uniform image2D g_image;" NL "void main() {" NL
							  "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  imageStore(g_image, coord, vec4(1.0));" NL
							  "  o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL "}";
		m_program[0] = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_early_frag_tests_fs);
		m_program[1] = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_fs);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);

		glViewport(0, 0, kSize, kSize);
		glBindVertexArray(m_vao);

		glEnable(GL_DEPTH_TEST);
		glClearColor(0.0, 1.0f, 0.0, 1.0f);
		glClearDepthf(0.0f);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glUniform1i(glGetUniformLocation(m_program[0], "g_image"), 0);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glUniform1i(glGetUniformLocation(m_program[1], "g_image"), 1);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0]);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (IsEqual(data[i], vec4(1.0f)) && ds != 0)
				return ERROR;
		}

		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0]);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!IsEqual(data[i], vec4(1.0f)) && ds != 0)
				return ERROR;
		}

		return NO_ERROR;
	}